

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptProxy.cpp
# Opt level: O2

BOOL __thiscall Js::JavascriptProxy::IsExtensible(JavascriptProxy *this)

{
  ImplicitCallFlags IVar1;
  ScriptContext *pSVar2;
  ThreadContext *this_00;
  code *pcVar3;
  bool bVar4;
  bool bVar5;
  Attributes attributes;
  BOOL BVar6;
  int iVar7;
  HostScriptContext *pHVar8;
  RecyclableObject *pRVar9;
  JavascriptFunction *function;
  undefined4 *puVar10;
  anon_class_32_4_be519e99 local_58;
  RecyclableObject *local_38;
  
  pSVar2 = (((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).ptr)
           ->super_JavascriptLibraryBase).scriptContext.ptr;
  ThreadContext::ProbeStack(pSVar2->threadContext,0xc00,pSVar2,(PVOID)0x0);
  this_00 = ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
              ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->threadContext;
  if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_External;
    return 0;
  }
  pHVar8 = ThreadContext::GetPreviousHostScriptContext(this_00);
  pSVar2 = pHVar8->scriptContext;
  pRVar9 = MarshalHandler(this,pSVar2);
  if (pRVar9 == (RecyclableObject *)0x0) {
    bVar4 = ThreadContext::RecordImplicitException(this_00);
    if (!bVar4) {
      return 0;
    }
    JavascriptError::ThrowTypeError
              ((((((this->super_DynamicObject).super_RecyclableObject.type.ptr)->javascriptLibrary).
                ptr)->super_JavascriptLibraryBase).scriptContext.ptr,-0x7ff5ea15,L"isExtensible");
  }
  local_38 = MarshalTarget(this,pSVar2);
  function = GetMethodHelper(this,0xc0,pSVar2);
  bVar4 = ScriptContext::IsHeapEnumInProgress(pSVar2);
  if (bVar4) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar10 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar10 = 1;
    bVar4 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/JavascriptProxy.cpp"
                                ,0x496,"(!requestContext->IsHeapEnumInProgress())",
                                "!requestContext->IsHeapEnumInProgress()");
    if (!bVar4) {
      pcVar3 = (code *)invalidInstructionException();
      (*pcVar3)();
    }
    *puVar10 = 0;
  }
  if (function == (JavascriptFunction *)0x0) {
    iVar7 = (*(local_38->super_FinalizableObject).super_IRecyclerVisitedObject.
              _vptr_IRecyclerVisitedObject[0x33])();
    return iVar7;
  }
  local_58.targetObj = local_38;
  bVar4 = this_00->reentrancySafeOrHandled;
  this_00->reentrancySafeOrHandled = true;
  local_58.threadContext = this_00;
  local_58.isExtensibleMethod = function;
  local_58.handlerObj = pRVar9;
  attributes = FunctionInfo::GetAttributes((RecyclableObject *)function);
  bVar5 = ThreadContext::HasNoSideEffect(this_00,(RecyclableObject *)function,attributes);
  if (bVar5) {
    pRVar9 = (RecyclableObject *)IsExtensible::anon_class_32_4_be519e99::operator()(&local_58);
    bVar5 = ThreadContext::IsOnStack(pRVar9);
  }
  else {
    if ((this_00->disableImplicitFlags & DisableImplicitCallFlag) != DisableImplicitNoFlag) {
      this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
      pRVar9 = (((((((((function->super_DynamicObject).super_RecyclableObject.type.ptr)->
                     javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr)->
                 super_ScriptContextBase).javascriptLibrary)->super_JavascriptLibraryBase).
               undefinedValue.ptr;
      goto LAB_00ba7972;
    }
    if ((attributes & HasNoSideEffect) == None) {
      IVar1 = this_00->implicitCallFlags;
      pRVar9 = (RecyclableObject *)IsExtensible::anon_class_32_4_be519e99::operator()(&local_58);
      this_00->implicitCallFlags = IVar1 | ImplicitCall_Accessor;
      goto LAB_00ba7972;
    }
    pRVar9 = (RecyclableObject *)IsExtensible::anon_class_32_4_be519e99::operator()(&local_58);
    bVar5 = ThreadContext::IsOnStack(pRVar9);
  }
  if (bVar5 != false) {
    this_00->implicitCallFlags = this_00->implicitCallFlags | ImplicitCall_Accessor;
  }
LAB_00ba7972:
  this_00->reentrancySafeOrHandled = bVar4;
  BVar6 = JavascriptConversion::ToBoolean(pRVar9,pSVar2);
  iVar7 = (*(local_38->super_FinalizableObject).super_IRecyclerVisitedObject.
            _vptr_IRecyclerVisitedObject[0x33])();
  if (BVar6 == iVar7) {
    return BVar6;
  }
  JavascriptError::ThrowTypeError(pSVar2,-0x7ff5ea14,L"isExtensible");
}

Assistant:

BOOL JavascriptProxy::IsExtensible()
    {
        PROBE_STACK(GetScriptContext(), Js::Constants::MinStackDefault);

        // Reject implicit call
        ThreadContext* threadContext = GetScriptContext()->GetThreadContext();
        if (threadContext->IsDisableImplicitCall())
        {
            threadContext->AddImplicitCallFlags(Js::ImplicitCall_External);
            return FALSE;
        }

        // Caller does not pass requestContext. Retrieve from host scriptContext stack.
        ScriptContext* requestContext =
            threadContext->GetPreviousHostScriptContext()->GetScriptContext();

        //1. Let handler be the value of the[[ProxyHandler]] internal slot of O.
        Js::RecyclableObject *handlerObj = this->MarshalHandler(requestContext);

        //2. If handler is null, then throw a TypeError exception.
        if (handlerObj == nullptr)
        {
            // the proxy has been revoked; TypeError.
            if (!threadContext->RecordImplicitException())
                return FALSE;
            JavascriptError::ThrowTypeError(GetScriptContext(), JSERR_ErrorOnRevokedProxy, _u("isExtensible"));
        }

        //3. Let target be the value of the[[ProxyTarget]] internal slot of O.
        Js::RecyclableObject *targetObj = this->MarshalTarget(requestContext);

        //4. Let trap be the result of GetMethod(handler, "isExtensible").
        //5. ReturnIfAbrupt(trap).
        //6. If trap is undefined, then
        //a.Return the result of calling the[[IsExtensible]] internal method of target.
        //7. Let trapResult be the result of calling the[[Call]] internal method of trap with handler as the this value and a new List containing target.
        //8. Let booleanTrapResult be ToBoolean(trapResult).
        //9. ReturnIfAbrupt(booleanTrapResult).
        //10. Let targetResult be the result of calling the[[IsExtensible]] internal method of target.
        //11. ReturnIfAbrupt(targetResult).
        //12. If SameValue(booleanTrapResult, targetResult) is false, then throw a TypeError exception.
        //13. Return booleanTrapResult.
        JavascriptFunction* isExtensibleMethod = GetMethodHelper(PropertyIds::isExtensible, requestContext);
        Assert(!requestContext->IsHeapEnumInProgress());
        if (nullptr == isExtensibleMethod)
        {
            return targetObj->IsExtensible();
        }

        Var isExtensibleResult = threadContext->ExecuteImplicitCall(isExtensibleMethod, ImplicitCall_Accessor, [=]()->Js::Var
        {
            return CALL_FUNCTION(threadContext, isExtensibleMethod, CallInfo(CallFlags_Value, 2), handlerObj, targetObj);
        });

        BOOL trapResult = JavascriptConversion::ToBoolean(isExtensibleResult, requestContext);
        BOOL targetIsExtensible = targetObj->IsExtensible();
        if (trapResult != targetIsExtensible)
        {
            JavascriptError::ThrowTypeError(requestContext, JSERR_InconsistentTrapResult, _u("isExtensible"));
        }
        return trapResult;
    }